

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Time.cpp
# Opt level: O0

String * __thiscall Time::toString(String *__return_storage_ptr__,Time *this,char *format)

{
  char *__s;
  usize uVar1;
  size_t length;
  usize len;
  char *buffer;
  undefined1 local_58 [8];
  tm tm;
  char *format_local;
  Time *this_local;
  String *result;
  
  tm.tm_zone = format;
  if (*format == '\0') {
    String::String(__return_storage_ptr__);
  }
  else {
    local_58._0_4_ = this->sec;
    local_58._4_4_ = this->min;
    tm.tm_sec = this->hour;
    tm.tm_min = this->day;
    tm.tm_hour = this->month + -1;
    tm.tm_mday = this->year + -0x76c;
    tm.tm_mon = this->wday;
    tm.tm_year = this->yday;
    tm.tm_wday = (int)(this->dst & 1);
    String::String(__return_storage_ptr__,0x100);
    while( true ) {
      __s = String::operator_cast_to_char_(__return_storage_ptr__);
      uVar1 = String::capacity(__return_storage_ptr__);
      length = strftime(__s,uVar1,tm.tm_zone,(tm *)local_58);
      if (length != 0) break;
      uVar1 = String::capacity(__return_storage_ptr__);
      String::reserve(__return_storage_ptr__,uVar1 * 2);
    }
    String::resize(__return_storage_ptr__,length);
  }
  return __return_storage_ptr__;
}

Assistant:

String Time::toString(const char* format)
{
  if(!*format)
    return String();
  tm tm;
  tm.tm_sec = sec;
  tm.tm_min = min;
  tm.tm_hour = hour;
  tm.tm_mday = day;
  tm.tm_mon = month - 1;
  tm.tm_year = year - 1900;
  tm.tm_wday = wday;
  tm.tm_yday = yday;
  tm.tm_isdst = dst;

  String result(256);
  char* buffer;
  usize len;
  for(;;)
  {
    buffer = result;
    len = strftime(buffer, result.capacity(), format, &tm);
    if(len > 0)
      break;
    result.reserve(result.capacity() * 2);
  }
  result.resize(len);
  return result;
}